

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorder.hpp
# Opt level: O2

void MGARD::data_reorder_1D<float>
               (float *data_pos,size_t n_nodal,size_t n_coeff,float *nodal_buffer,
               float *coeff_buffer)

{
  float fVar1;
  int i;
  size_t sVar2;
  float *nodal_pos;
  float *cur_data_pos;
  float *coeff_pos;
  
  for (sVar2 = 0; n_coeff != sVar2; sVar2 = sVar2 + 1) {
    nodal_buffer[sVar2] = data_pos[sVar2 * 2];
    coeff_buffer[sVar2] = data_pos[sVar2 * 2 + 1];
  }
  fVar1 = data_pos[sVar2 * 2];
  nodal_buffer[sVar2] = fVar1;
  if (n_coeff + 2 == n_nodal) {
    nodal_buffer[sVar2 + 1] = (data_pos[sVar2 * 2 + 1] + data_pos[sVar2 * 2 + 1]) - fVar1;
  }
  return;
}

Assistant:

void data_reorder_1D(const T * data_pos, size_t n_nodal, size_t n_coeff, T * nodal_buffer, T * coeff_buffer){
    T * nodal_pos = nodal_buffer;
    T * coeff_pos = coeff_buffer;
    T const * cur_data_pos = data_pos;
    for(int i=0; i<n_coeff; i++){
        *(nodal_pos++) = *(cur_data_pos++);
        *(coeff_pos++) = *(cur_data_pos++);
    }
    *(nodal_pos++) = *(cur_data_pos++);
    if(n_nodal == n_coeff + 2){
        // if even, add a nodal value such that the interpolant
        // of the last two nodal values equal to the last coefficient
        *nodal_pos = 2*cur_data_pos[0] - nodal_pos[-1];
    }
}